

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O1

void Dar_ManRefStop(Ref_Man_t *p)

{
  Vec_Vec_t *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *__ptr_01;
  long lVar2;
  
  if (p->pManDec != (Bdc_Man_t *)0x0) {
    Bdc_ManFree(p->pManDec);
  }
  if (p->pPars->fVerbose != 0) {
    Dar_ManRefPrintStats(p);
  }
  __ptr = p->vCuts;
  if (0 < __ptr->nSize) {
    lVar2 = 0;
    do {
      __ptr_00 = __ptr->pArray[lVar2];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
          *(undefined8 *)((long)__ptr_00 + 8) = 0;
        }
        free(__ptr_00);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    free(__ptr);
  }
  pVVar1 = p->vTruthElem;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vTruthStore;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLeavesBest;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  __ptr_01 = p->vMemory;
  if (__ptr_01->pArray != (int *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (int *)0x0;
  }
  if (__ptr_01 != (Vec_Int_t *)0x0) {
    free(__ptr_01);
  }
  pVVar1 = p->vCutNodes;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  free(p);
  return;
}

Assistant:

void Dar_ManRefStop( Ref_Man_t * p )
{
    if ( p->pManDec )
        Bdc_ManFree( p->pManDec );
    if ( p->pPars->fVerbose )
        Dar_ManRefPrintStats( p );
    Vec_VecFree( p->vCuts );
    Vec_PtrFree( p->vTruthElem );
    Vec_PtrFree( p->vTruthStore );
    Vec_PtrFree( p->vLeavesBest );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vCutNodes );
    ABC_FREE( p );
}